

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Not_Full(Var aRight,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  Var pvVar7;
  
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_009907d2;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(aRight);
  if ((ulong)aRight >> 0x32 == 0 && !bVar3) {
    this = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009907d2;
      *puVar6 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_BigInt) {
        pvVar7 = JavascriptBigInt::Not(aRight);
        return pvVar7;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_009907d2:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  }
  uVar5 = JavascriptConversion::ToInt32(aRight,scriptContext);
  return (Var)((ulong)~uVar5 | 0x1000000000000);
}

Assistant:

Var JavascriptMath::Not_Full(Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Not_Full);
#if _M_IX86
            AssertMsg(!TaggedInt::Is(aRight), "Should be detected");
#endif
            if (JavascriptOperators::GetTypeId(aRight) == TypeIds_BigInt)
            {
                return JavascriptBigInt::Not(aRight);
            }

            int nValue = JavascriptConversion::ToInt32(aRight, scriptContext);
            return JavascriptNumber::ToVar(~nValue, scriptContext);
            JIT_HELPER_END(Op_Not_Full);
        }